

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O0

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::ShortPrint
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoCube> *this,ostream *out)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  int64_t iVar4;
  TPZCompElSide *this_00;
  TPZCompEl *pTVar5;
  TPZGeoEl *pTVar6;
  int64_t iVar7;
  TPZManVector<TPZTransform<double>,_10> *this_01;
  ostream *in_RSI;
  long *in_RDI;
  TPZManVector<TPZTransform<double>,_10> tr;
  TPZCompEl *cel;
  int64_t iel;
  int64_t nmesh;
  const_iterator it;
  list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> restraints;
  list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *in_stack_ffffffffffffeea8;
  list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *in_stack_ffffffffffffeeb0;
  TPZTransform<double> *in_stack_ffffffffffffeeb8;
  ostream *in_stack_ffffffffffffeec8;
  TPZOneShapeRestraint *in_stack_ffffffffffffeed0;
  TPZVec<TPZTransform<double>_> local_10d8;
  ostream *in_stack_ffffffffffffef48;
  TPZManVector<TPZTransform<double>,_10> *in_stack_ffffffffffffef50;
  int64_t local_70;
  iterator local_58;
  _List_const_iterator<TPZOneShapeRestraint> local_50;
  iterator local_48;
  _List_const_iterator<TPZOneShapeRestraint> local_40 [3];
  undefined1 local_28 [24];
  ostream *local_10;
  
  local_10 = in_RSI;
  poVar2 = std::operator<<(in_RSI,
                           "virtual void TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::ShortPrint(std::ostream &) const [TGeometry = pzgeom::TPZGeoCube]"
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_10,"\n\tMulti-physics element:: \n");
  TPZCompEl::Print((TPZCompEl *)in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
  (**(code **)(*in_RDI + 0x1a0))(local_28);
  sVar3 = std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::size
                    (in_stack_ffffffffffffeeb0);
  if (sVar3 != 0) {
    std::operator<<(local_10,"One shape restraints\n");
    local_48._M_node =
         (_List_node_base *)
         std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::begin
                   (in_stack_ffffffffffffeea8);
    std::_List_const_iterator<TPZOneShapeRestraint>::_List_const_iterator(local_40,&local_48);
    while( true ) {
      local_58._M_node =
           (_List_node_base *)
           std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::end
                     (in_stack_ffffffffffffeea8);
      std::_List_const_iterator<TPZOneShapeRestraint>::_List_const_iterator(&local_50,&local_58);
      bVar1 = std::operator!=(local_40,&local_50);
      if (!bVar1) break;
      std::_List_const_iterator<TPZOneShapeRestraint>::operator->
                ((_List_const_iterator<TPZOneShapeRestraint> *)in_stack_ffffffffffffeeb0);
      TPZOneShapeRestraint::Print(in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
      std::_List_const_iterator<TPZOneShapeRestraint>::operator++(local_40,0);
    }
  }
  std::operator<<(local_10,"\n\tComputational elements within this multi-physics element: \n\n");
  iVar4 = TPZVec<TPZCompElSide>::size((TPZVec<TPZCompElSide> *)(in_RDI + 0xf));
  for (local_70 = 0; local_70 < iVar4; local_70 = local_70 + 1) {
    poVar2 = std::operator<<(local_10,"Computational element belonging to the mesh ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_70);
    std::operator<<(poVar2,":\n");
    this_00 = TPZVec<TPZCompElSide>::operator[]((TPZVec<TPZCompElSide> *)(in_RDI + 0xf),local_70);
    pTVar5 = TPZCompElSide::Element(this_00);
    if (pTVar5 == (TPZCompEl *)0x0) {
      poVar2 = std::operator<<(local_10,"There is not element to computational mesh ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_70);
      std::operator<<(poVar2,"\n");
    }
    else {
      (**(code **)(*(long *)pTVar5 + 0xd0))(pTVar5,local_10);
      pTVar6 = TPZCompEl::Reference((TPZCompEl *)in_stack_ffffffffffffeeb8);
      if (pTVar6 != (TPZGeoEl *)0x0) {
        poVar2 = std::operator<<(local_10,"\tReference Index = ");
        pTVar6 = TPZCompEl::Reference((TPZCompEl *)in_stack_ffffffffffffeeb8);
        iVar7 = TPZGeoEl::Index(pTVar6);
        std::ostream::operator<<(poVar2,iVar7);
        TPZManVector<TPZTransform<double>,_10>::TPZManVector
                  (in_stack_ffffffffffffef50,(int64_t)in_stack_ffffffffffffef48);
        (**(code **)(*in_RDI + 0x280))(in_RDI,&local_10d8);
        this_01 = (TPZManVector<TPZTransform<double>,_10> *)
                  std::operator<<(local_10,
                                  "\n\tAffine transformation of the multiphysics element for this computational element:"
                                 );
        std::operator<<((ostream *)this_01,"\n");
        std::ostream::operator<<(local_10,std::endl<char,std::char_traits<char>>);
        in_stack_ffffffffffffeeb8 = (TPZTransform<double> *)std::operator<<(local_10,"\t");
        TPZVec<TPZTransform<double>_>::operator[](&local_10d8,local_70);
        ::operator<<((ostream *)this_01,in_stack_ffffffffffffeeb8);
        TPZManVector<TPZTransform<double>,_10>::~TPZManVector(this_01);
      }
    }
  }
  std::operator<<(local_10,
                  "---------------------------------------------------------------------------------------------------------------------------------------------------------------------------------\n"
                 );
  std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::~list
            ((list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)0x1b6fd20);
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::ShortPrint(std::ostream & out) const {

    out << __PRETTY_FUNCTION__ << std::endl;
    out << "\n\tMulti-physics element:: \n";
    TPZCompEl::Print(out);

    std::list<TPZOneShapeRestraint> restraints = this->GetShapeRestraints();
    if(restraints.size())
    {
        out << "One shape restraints\n";
        for (std::list<TPZOneShapeRestraint>::const_iterator it = restraints.begin(); it != restraints.end(); it++) {
            it->Print(out);
        }
    }

    out << "\n\tComputational elements within this multi-physics element: \n\n";
    int64_t nmesh  = fElementVec.size();
    for(int64_t iel = 0; iel< nmesh; iel++ ){

        out << "Computational element belonging to the mesh " << iel <<":\n";
        TPZCompEl *cel = fElementVec[iel].Element();
        if(!cel){
            out << "There is not element to computational mesh " << iel <<"\n";
            continue;
        }
        cel->ShortPrint(out);
        if(!cel->Reference()) continue;
        out << "\tReference Index = " << cel->Reference()->Index();

        TPZManVector<TPZTransform<> > tr;
        AffineTransform(tr);
        out << "\n\tAffine transformation of the multiphysics element for this computational element:"<<"\n";
        out << std::endl;
        out <<"\t" << tr[iel];
    }
    out << "---------------------------------------------------------------------------------------------------------------------------------------------------------------------------------\n";
}